

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRandom.h
# Opt level: O0

double __thiscall HighsRandom::closedFraction(HighsRandom *this)

{
  u64 uVar1;
  u64 uVar2;
  ulong uVar3;
  HighsRandom *in_RDI;
  undefined1 auVar4 [16];
  uint64_t output;
  
  advance(in_RDI);
  uVar1 = HighsHashHelpers::pair_hash<0>((u32)in_RDI->state,(u32)(in_RDI->state >> 0x20));
  uVar2 = HighsHashHelpers::pair_hash<1>((u32)in_RDI->state,(u32)(in_RDI->state >> 0x20));
  uVar3 = uVar1 >> 0xb ^ uVar2 >> 0x20;
  auVar4._8_4_ = (uint)(uVar1 >> 0x2b);
  auVar4._0_8_ = uVar3;
  auVar4._12_4_ = 0x45300000;
  return ((auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) * 1.1102230246251565e-16;
}

Assistant:

double closedFraction() {
    advance();
    // 53 bit result is in interval [0,2^53-1]
    uint64_t output = (HighsHashHelpers::pair_hash<0>(
                           static_cast<uint32_t>(state), state >> 32) >>
                       (64 - 53)) ^
                      (HighsHashHelpers::pair_hash<1>(
                           static_cast<uint32_t>(state), state >> 32) >>
                       32);
    // compute output / (2^53-1) in double precision which is in the closed
    // interval [0,1]
    return static_cast<double>(output) * 1.1102230246251566e-16;
  }